

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_fusearef(ASMState *as,IRIns *ir,RegSet allow)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  IRIns *pIVar4;
  bool bVar5;
  byte bVar6;
  IRIns *ir_1;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  Reg RVar7;
  
  uVar2 = (ir->field_0).op1;
  uVar8 = (ulong)uVar2;
  pIVar4 = as->ir;
  (as->mrm).ofs = 0;
  cVar1 = *(char *)((long)pIVar4 + uVar8 * 8 + 5);
  if (cVar1 == ')') {
    lVar9 = (long)*(short *)((long)pIVar4 + uVar8 * 8 + 2);
    if (-1 < lVar9) {
      (as->mrm).ofs = pIVar4[lVar9].field_1.op12;
      uVar10 = (ulong)pIVar4[uVar8].field_0.op1;
      goto LAB_00146491;
    }
  }
  else if (cVar1 == 'E') {
    uVar3 = pIVar4[uVar8].field_0.op1;
    uVar10 = (ulong)uVar3;
    bVar5 = true;
    if ((((*(char *)((long)pIVar4 + uVar10 * 8 + 5) == 'Q') && (pIVar4[uVar10].field_0.op1 < 0x11))
        && (as->fuseref != 0xffffffff)) && (uVar11 = as->curins, uVar11 <= uVar3 + 0x1f)) {
      do {
        uVar11 = uVar11 - 1;
        if (uVar11 <= uVar3) {
          (as->mrm).ofs = 0x40;
          uVar10 = (ulong)pIVar4[uVar8].field_0.op1;
          bVar5 = false;
          break;
        }
      } while (*(char *)((long)pIVar4 + (ulong)uVar11 * 8 + 5) != ';');
    }
    if (!bVar5) goto LAB_00146491;
  }
  uVar10 = (ulong)uVar2;
LAB_00146491:
  bVar6 = *(byte *)((long)pIVar4 + uVar10 * 8 + 6);
  if ((char)bVar6 < '\0') {
    RVar7 = ra_allocref(as,(IRRef)uVar10,allow);
    bVar6 = (byte)RVar7;
  }
  uVar11 = -2 << (bVar6 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar6 & 0x1f);
  as->weakset = as->weakset & uVar11;
  (as->mrm).base = bVar6;
  if ((long)(short)(ir->field_0).op2 < 0) {
    (as->mrm).scale = 0xc0;
    bVar6 = *(byte *)((long)as->ir + (ulong)(ir->field_0).op2 * 8 + 6);
    if ((char)bVar6 < '\0') {
      RVar7 = ra_allocref(as,(uint)(ir->field_0).op2,uVar11 & allow);
      bVar6 = (byte)RVar7;
    }
    as->weakset = as->weakset & (-2 << (bVar6 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar6 & 0x1f));
  }
  else {
    (as->mrm).ofs = (as->mrm).ofs + as->ir[(short)(ir->field_0).op2].field_1.op12 * 8;
    bVar6 = 0x80;
  }
  (as->mrm).idx = bVar6;
  return;
}

Assistant:

static void asm_fusearef(ASMState *as, IRIns *ir, RegSet allow)
{
  IRIns *irx;
  lj_assertA(ir->o == IR_AREF, "expected AREF");
  as->mrm.base = (uint8_t)ra_alloc1(as, asm_fuseabase(as, ir->op1), allow);
  irx = IR(ir->op2);
  if (irref_isk(ir->op2)) {
    as->mrm.ofs += 8*irx->i;
    as->mrm.idx = RID_NONE;
  } else {
    rset_clear(allow, as->mrm.base);
    as->mrm.scale = XM_SCALE8;
    /* Fuse a constant ADD (e.g. t[i+1]) into the offset.
    ** Doesn't help much without ABCelim, but reduces register pressure.
    */
    if (!LJ_64 &&  /* Has bad effects with negative index on x64. */
	mayfuse(as, ir->op2) && ra_noreg(irx->r) &&
	irx->o == IR_ADD && irref_isk(irx->op2)) {
      as->mrm.ofs += 8*IR(irx->op2)->i;
      as->mrm.idx = (uint8_t)ra_alloc1(as, irx->op1, allow);
    } else {
      as->mrm.idx = (uint8_t)ra_alloc1(as, ir->op2, allow);
    }
  }
}